

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *this;
  ImVec2 IVar3;
  ImGuiID id;
  char *str;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  ImRect bb;
  ImRect inner_rect;
  ImRect local_38;
  ImVec2 local_28;
  ImVec2 IStack_20;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  fVar1 = (this->Pos).x;
  fVar2 = (this->Pos).y;
  local_38.Max.x = (this->Size).x + fVar1;
  fVar6 = (this->Size).y + fVar2;
  local_28 = (this->InnerRect).Min;
  IStack_20 = (this->InnerRect).Max;
  IVar3 = local_28;
  if ((uint)axis < 2) {
    fVar7 = (&(this->ScrollbarSizes).x)[(uint)(axis ^ ImGuiAxis_Y)];
    if (0.0 < fVar7) {
      uVar4 = (uint)((&(this->ScrollbarSizes).x)[(uint)axis] <= 0.0) << 3;
      if (axis == ImGuiAxis_X) {
        fVar7 = (fVar6 - this->WindowBorderSize) - fVar7;
        uVar5 = -(uint)(fVar7 <= fVar2);
        local_38.Min.y = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)fVar7);
        local_38.Min.x = local_28.x;
        local_38.Max.y = fVar6;
        local_38.Max.x = IStack_20.x;
        uVar4 = uVar4 | 4;
      }
      else {
        fVar7 = (local_38.Max.x - this->WindowBorderSize) - fVar7;
        uVar5 = -(uint)(fVar7 <= fVar1);
        local_38.Min.y = local_28.y;
        local_38.Min.x = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)fVar7);
        local_38.Max.y = (this->InnerRect).Max.y;
        uVar4 = uVar4 | (uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2;
      }
      fVar1 = (&(this->WindowPadding).x)[(uint)axis];
      local_28 = IVar3;
      ScrollbarEx(&local_38,id,axis,&(this->Scroll).x + (uint)axis,
                  (&IStack_20.x)[(uint)axis] - (&local_28.x)[(uint)axis],
                  fVar1 + fVar1 + (&(this->ContentSize).x)[(uint)axis],uVar4);
      return;
    }
    __assert_fail("scrollbar_size > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui_widgets.cpp"
                  ,0x39d,"void ImGui::Scrollbar(ImGuiAxis)");
  }
  __assert_fail("idx <= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                ,0xd6,"float &ImVec2::operator[](size_t)");
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1];
    IM_ASSERT(scrollbar_size > 0.0f);
    const float other_scrollbar_size = window->ScrollbarSizes[axis];
    ImDrawCornerFlags rounding_corners = (other_scrollbar_size <= 0.0f) ? ImDrawCornerFlags_BotRight : 0;
    ImRect bb;
    if (axis == ImGuiAxis_X)
    {
        bb.Min = ImVec2(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size));
        bb.Max = ImVec2(inner_rect.Max.x, outer_rect.Max.y);
        rounding_corners |= ImDrawCornerFlags_BotLeft;
    }
    else
    {
        bb.Min = ImVec2(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y);
        bb.Max = ImVec2(outer_rect.Max.x, window->InnerRect.Max.y);
        rounding_corners |= ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0;
    }
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], inner_rect.Max[axis] - inner_rect.Min[axis], window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f, rounding_corners);
}